

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O3

Error * __thiscall
ot::commissioner::coap::Message::GetContentFormat
          (Error *__return_storage_ptr__,Message *this,ContentFormat *aContentFormat)

{
  ErrorCode EVar1;
  uint32_t value;
  ContentFormat local_54;
  undefined1 local_50 [8];
  _Alloc_hider local_48;
  char local_38 [16];
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  GetOption((Error *)local_50,this,&local_54,kContentFormat);
  __return_storage_ptr__->mCode = local_50._0_4_;
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->mMessage,(string *)&local_48);
  EVar1 = __return_storage_ptr__->mCode;
  if (local_48._M_p != local_38) {
    operator_delete(local_48._M_p);
  }
  if (EVar1 == kNone) {
    *aContentFormat = local_54;
  }
  return __return_storage_ptr__;
}

Assistant:

Error Message::GetContentFormat(ContentFormat &aContentFormat) const
{
    Error    error;
    uint32_t value;

    SuccessOrExit(error = GetOption(value, OptionType::kContentFormat));
    aContentFormat = utils::from_underlying<ContentFormat>(value);

exit:
    return error;
}